

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::PrintFieldDescriptor
          (Generator *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  float fVar1;
  double dVar2;
  byte bVar3;
  undefined1 uVar4;
  undefined1 uVar6;
  undefined2 uVar7;
  ushort *puVar5;
  Printer *this_00;
  undefined4 uVar8;
  bool bVar9;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar10;
  char *pcVar11;
  size_t sVar12;
  EnumValueDescriptor *pEVar13;
  uint *b;
  int __c;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  AlphaNum *a_03;
  AlphaNum *a_04;
  AlphaNum *a_05;
  AlphaNum *a_06;
  AlphaNum *a_07;
  AlphaNum *a_08;
  AlphaNum *a_09;
  AlphaNum *a_10;
  string *__s;
  io *this_01;
  FieldOptions *this_02;
  AlphaNum *in_R8;
  string_view serialized_options;
  string_view text;
  string_view src;
  string sStack_2e8;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  string local_2a0;
  AlphaNum local_280;
  double local_250;
  string options_string;
  char field_descriptor_decl [455];
  AlphaNum local_60;
  
  options_string._M_dataplus._M_p = (pointer)&options_string.field_2;
  options_string._M_string_length = 0;
  options_string.field_2._M_local_buf[0] = '\0';
  this_02 = (proto->field_0)._impl_.options_;
  if (this_02 == (FieldOptions *)0x0) {
    this_02 = (FieldOptions *)&_FieldOptions_default_instance_;
  }
  MessageLite::SerializeToString((MessageLite *)this_02,&options_string);
  m.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  m.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  m.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  puVar5 = (ushort *)(field->all_names_).payload_;
  local_280.piece_._M_len = (size_t)*puVar5;
  local_280.piece_._M_str = (char *)((long)puVar5 + ~local_280.piece_._M_len);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)field_descriptor_decl,&local_280.piece_,(allocator<char> *)&local_60);
  pbVar10 = absl::lts_20250127::container_internal::
            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
            ::
            operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                      ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                        *)&m,(key_arg<char[5]> *)0xd8d1e3);
  std::__cxx11::string::operator=((string *)pbVar10,(string *)field_descriptor_decl);
  std::__cxx11::string::~string((string *)field_descriptor_decl);
  pcVar11 = (field->all_names_).payload_;
  local_280.piece_._M_len = (size_t)*(ushort *)(pcVar11 + 2);
  b = (uint *)(pcVar11 + ~local_280.piece_._M_len);
  local_280.piece_._M_str = (char *)b;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)field_descriptor_decl,&local_280.piece_,(allocator<char> *)&local_60);
  pbVar10 = absl::lts_20250127::container_internal::
            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
            ::
            operator[]<char[10],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                      ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                        *)&m,(key_arg<char[10]> *)0x10a7999);
  __s = (string *)field_descriptor_decl;
  std::__cxx11::string::operator=((string *)pbVar10,(string *)field_descriptor_decl);
  std::__cxx11::string::~string((string *)field_descriptor_decl);
  pcVar11 = FieldDescriptor::index(field,(char *)__s,__c);
  absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)field_descriptor_decl,(int)pcVar11);
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)&local_280,(lts_20250127 *)field_descriptor_decl,a);
  pbVar10 = absl::lts_20250127::container_internal::
            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
            ::
            operator[]<char[6],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                      ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                        *)&m,(key_arg<char[6]> *)0xd9f68f);
  std::__cxx11::string::operator=((string *)pbVar10,(string *)&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)field_descriptor_decl,field->number_);
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)&local_280,(lts_20250127 *)field_descriptor_decl,a_00);
  pbVar10 = absl::lts_20250127::container_internal::
            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
            ::
            operator[]<char[7],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                      ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                        *)&m,(key_arg<char[7]> *)0xe43eb3);
  std::__cxx11::string::operator=((string *)pbVar10,(string *)&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)field_descriptor_decl,(uint)field->type_);
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)&local_280,(lts_20250127 *)field_descriptor_decl,a_01);
  pbVar10 = absl::lts_20250127::container_internal::
            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
            ::
            operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                      ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                        *)&m,(key_arg<char[5]> *)0xde104b);
  std::__cxx11::string::operator=((string *)pbVar10,(string *)&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  absl::lts_20250127::AlphaNum::AlphaNum
            ((AlphaNum *)field_descriptor_decl,
             *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4));
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)&local_280,(lts_20250127 *)field_descriptor_decl,a_02);
  pbVar10 = absl::lts_20250127::container_internal::
            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
            ::
            operator[]<char[9],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                      ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                        *)&m,(key_arg<char[9]> *)"cpp_type");
  std::__cxx11::string::operator=((string *)pbVar10,(string *)&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  bVar3 = field->field_0x1;
  pbVar10 = absl::lts_20250127::container_internal::
            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
            ::
            operator[]<char[18],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                      ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                        *)&m,(key_arg<char[18]> *)"has_default_value");
  this_01 = (io *)0xd7558b;
  if ((bVar3 & 1) != 0) {
    this_01 = (io *)0xe7ab1c;
  }
  std::__cxx11::string::assign((char *)pbVar10);
  bVar9 = FieldDescriptor::is_repeated(field);
  if (bVar9) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_2e8,"[]",(allocator<char> *)field_descriptor_decl);
    goto LAB_00b63769;
  }
  b = &switchD_00b63846::switchdataD_00ffb3f0;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
    absl::lts_20250127::AlphaNum::AlphaNum
              ((AlphaNum *)field_descriptor_decl,(field->field_20).default_value_int32_t_);
    absl::lts_20250127::StrCat_abi_cxx11_(&sStack_2e8,(lts_20250127 *)field_descriptor_decl,a_03);
    break;
  case 2:
    absl::lts_20250127::AlphaNum::AlphaNum
              ((AlphaNum *)field_descriptor_decl,(field->field_20).default_value_int64_t_);
    absl::lts_20250127::StrCat_abi_cxx11_(&sStack_2e8,(lts_20250127 *)field_descriptor_decl,a_10);
    break;
  case 3:
    absl::lts_20250127::AlphaNum::AlphaNum
              ((AlphaNum *)field_descriptor_decl,(field->field_20).default_value_uint32_t_);
    absl::lts_20250127::StrCat_abi_cxx11_(&sStack_2e8,(lts_20250127 *)field_descriptor_decl,a_07);
    break;
  case 4:
    absl::lts_20250127::AlphaNum::AlphaNum
              ((AlphaNum *)field_descriptor_decl,(field->field_20).default_value_uint64_t_);
    absl::lts_20250127::StrCat_abi_cxx11_(&sStack_2e8,(lts_20250127 *)field_descriptor_decl,a_08);
    break;
  case 5:
    dVar2 = (field->field_20).default_value_double_;
    if (INFINITY <= dVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_2e8,"1e10000",(allocator<char> *)field_descriptor_decl);
      break;
    }
    if (dVar2 <= -INFINITY) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_2e8,"-1e10000",(allocator<char> *)field_descriptor_decl);
      break;
    }
    local_250 = dVar2;
    if (NAN(dVar2)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_2e8,"(1e10000 * 0)",(allocator<char> *)field_descriptor_decl);
      break;
    }
    field_descriptor_decl._0_16_ =
         (undefined1  [16])absl::lts_20250127::NullSafeStringView("float(");
    io::SimpleDtoa_abi_cxx11_(&local_2a0,this_01,local_250);
    local_280.piece_._M_len = local_2a0._M_string_length;
    local_280.piece_._M_str = local_2a0._M_dataplus._M_p;
    local_60.piece_ = absl::lts_20250127::NullSafeStringView(")");
    b = (uint *)&local_60;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&sStack_2e8,(lts_20250127 *)field_descriptor_decl,&local_280,(AlphaNum *)b,in_R8);
    goto LAB_00b63bf4;
  case 6:
    fVar1 = (field->field_20).default_value_float_;
    if (INFINITY <= fVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_2e8,"1e10000",(allocator<char> *)field_descriptor_decl);
      break;
    }
    if (fVar1 <= -INFINITY) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_2e8,"-1e10000",(allocator<char> *)field_descriptor_decl);
      break;
    }
    local_250 = (double)CONCAT44(local_250._4_4_,fVar1);
    if (NAN(fVar1)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_2e8,"(1e10000 * 0)",(allocator<char> *)field_descriptor_decl);
      break;
    }
    field_descriptor_decl._0_16_ =
         (undefined1  [16])absl::lts_20250127::NullSafeStringView("float(");
    io::SimpleFtoa_abi_cxx11_(&local_2a0,this_01,local_250._0_4_);
    local_280.piece_._M_len = local_2a0._M_string_length;
    local_280.piece_._M_str = local_2a0._M_dataplus._M_p;
    local_60.piece_ = absl::lts_20250127::NullSafeStringView(")");
    b = (uint *)&local_60;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&sStack_2e8,(lts_20250127 *)field_descriptor_decl,&local_280,(AlphaNum *)b,in_R8);
    goto LAB_00b63bf4;
  case 7:
    pcVar11 = "False";
    if ((field->field_20).default_value_bool_ != false) {
      pcVar11 = "True";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_2e8,pcVar11,(allocator<char> *)field_descriptor_decl);
    break;
  case 8:
    pEVar13 = FieldDescriptor::default_value_enum(field);
    absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)field_descriptor_decl,pEVar13->number_);
    absl::lts_20250127::StrCat_abi_cxx11_(&sStack_2e8,(lts_20250127 *)field_descriptor_decl,a_09);
    break;
  case 9:
    field_descriptor_decl._0_16_ = (undefined1  [16])absl::lts_20250127::NullSafeStringView("b\"");
    pEVar13 = (field->field_20).default_value_enum_;
    uVar4 = pEVar13->super_SymbolBaseN<0>;
    uVar6 = pEVar13->super_SymbolBaseN<1>;
    uVar7 = *(undefined2 *)&pEVar13->field_0x2;
    uVar8 = pEVar13->number_;
    src._M_len._4_4_ = uVar8;
    src._M_len._2_2_ = uVar7;
    src._M_len._1_1_ = uVar6;
    src._M_len._0_1_ = uVar4;
    src._M_str = (char *)b;
    absl::lts_20250127::CEscape_abi_cxx11_(&local_2a0,(lts_20250127 *)pEVar13->all_names_,src);
    local_280.piece_._M_len = local_2a0._M_string_length;
    local_280.piece_._M_str = local_2a0._M_dataplus._M_p;
    pcVar11 = "\"";
    if (field->type_ == '\t') {
      pcVar11 = "\".decode(\'utf-8\')";
    }
    local_60.piece_ = absl::lts_20250127::NullSafeStringView(pcVar11);
    b = (uint *)&local_60;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&sStack_2e8,(lts_20250127 *)field_descriptor_decl,&local_280,(AlphaNum *)b,in_R8);
LAB_00b63bf4:
    std::__cxx11::string::~string((string *)&local_2a0);
    break;
  case 10:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_2e8,"None",(allocator<char> *)field_descriptor_decl);
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)field_descriptor_decl,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/python/generator.cc"
               ,0x9d);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)field_descriptor_decl,(char (*) [13])"Not reached.");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)field_descriptor_decl);
  }
LAB_00b63769:
  pbVar10 = absl::lts_20250127::container_internal::
            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
            ::
            operator[]<char[14],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                      ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                        *)&m,(key_arg<char[14]> *)0x105980c);
  std::__cxx11::string::operator=((string *)pbVar10,(string *)&sStack_2e8);
  std::__cxx11::string::~string((string *)&sStack_2e8);
  pbVar10 = absl::lts_20250127::container_internal::
            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
            ::
            operator[]<char[13],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                      ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                        *)&m,(key_arg<char[13]> *)"is_extension");
  std::__cxx11::string::assign((char *)pbVar10);
  serialized_options._M_str = (char *)b;
  serialized_options._M_len = (size_t)options_string._M_dataplus._M_p;
  python::(anonymous_namespace)::OptionsValue_abi_cxx11_
            ((string *)field_descriptor_decl,
             (_anonymous_namespace_ *)options_string._M_string_length,serialized_options);
  pbVar10 = absl::lts_20250127::container_internal::
            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
            ::
            operator[]<char[19],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                      ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                        *)&m,(key_arg<char[19]> *)0xddc802);
  std::__cxx11::string::operator=((string *)pbVar10,(string *)field_descriptor_decl);
  std::__cxx11::string::~string((string *)field_descriptor_decl);
  if ((field->field_0x1 & 4) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,anon_var_dwarf_651463 + 5,(allocator<char> *)&sStack_2e8);
  }
  else {
    field_descriptor_decl._0_16_ =
         (undefined1  [16])absl::lts_20250127::NullSafeStringView(", json_name=\'");
    pcVar11 = (field->all_names_).payload_;
    local_280.piece_._M_len = (size_t)*(ushort *)(pcVar11 + 0xe);
    local_280.piece_._M_str = pcVar11 + -(ulong)*(ushort *)(pcVar11 + 0xc);
    local_60.piece_ = absl::lts_20250127::NullSafeStringView("\'");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_2a0,(lts_20250127 *)field_descriptor_decl,&local_280,&local_60,in_R8);
  }
  pbVar10 = absl::lts_20250127::container_internal::
            raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
            ::
            operator[]<char[10],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                      ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                        *)&m,(key_arg<char[10]> *)0x10597ec);
  std::__cxx11::string::operator=((string *)pbVar10,(string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  bVar9 = FieldDescriptor::is_required(field);
  if (bVar9) {
    absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)field_descriptor_decl,2);
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_280,(lts_20250127 *)field_descriptor_decl,a_04);
    pbVar10 = absl::lts_20250127::container_internal::
              raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
              ::
              operator[]<char[6],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                        ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                          *)&m,(key_arg<char[6]> *)"label");
  }
  else {
    bVar9 = FieldDescriptor::is_repeated(field);
    if (bVar9) {
      absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)field_descriptor_decl,3);
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)&local_280,(lts_20250127 *)field_descriptor_decl,a_05);
      pbVar10 = absl::lts_20250127::container_internal::
                raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                ::
                operator[]<char[6],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                          ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                            *)&m,(key_arg<char[6]> *)"label");
    }
    else {
      absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)field_descriptor_decl,1);
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)&local_280,(lts_20250127 *)field_descriptor_decl,a_06);
      pbVar10 = absl::lts_20250127::container_internal::
                raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                ::
                operator[]<char[6],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                          ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                            *)&m,(key_arg<char[6]> *)"label");
    }
  }
  std::__cxx11::string::operator=((string *)pbVar10,(string *)&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  memcpy(field_descriptor_decl,
         "_descriptor.FieldDescriptor(\n  name=\'$name$\', full_name=\'$full_name$\', index=$index$,\n  number=$number$, type=$type$, cpp_type=$cpp_type$, label=$label$,\n  has_default_value=$has_default_value$, default_value=$default_value$,\n  message_type=None, enum_type=None, containing_type=None,\n  is_extension=$is_extension$, extension_scope=None,\n  serialized_options=$serialized_options$$json_name$, file=DESCRIPTOR,  create_key=_descriptor._internal_create_key)"
         ,0x1c7);
  this_00 = this->printer_;
  sVar12 = strlen(field_descriptor_decl);
  text._M_str = field_descriptor_decl;
  text._M_len = sVar12;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (this_00,&m,text);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&m);
  std::__cxx11::string::~string((string *)&options_string);
  return;
}

Assistant:

void Generator::PrintFieldDescriptor(const FieldDescriptor& field,
                                     const FieldDescriptorProto& proto) const {
  std::string options_string;
  proto.options().SerializeToString(&options_string);
  absl::flat_hash_map<absl::string_view, std::string> m;
  m["name"] = std::string(field.name());
  m["full_name"] = std::string(field.full_name());
  m["index"] = absl::StrCat(field.index());
  m["number"] = absl::StrCat(field.number());
  m["type"] = absl::StrCat(field.type());
  m["cpp_type"] = absl::StrCat(field.cpp_type());
  m["has_default_value"] = field.has_default_value() ? "True" : "False";
  m["default_value"] = StringifyDefaultValue(field);
  m["is_extension"] = field.is_extension() ? "True" : "False";
  m["serialized_options"] = OptionsValue(options_string);
  m["json_name"] = field.has_json_name()
                       ? absl::StrCat(", json_name='", field.json_name(), "'")
                       : "";
  if (field.is_required()) {
    m["label"] = absl::StrCat(FieldDescriptor::Label::LABEL_REQUIRED);
  } else if (field.is_repeated()) {
    m["label"] = absl::StrCat(FieldDescriptor::Label::LABEL_REPEATED);
  } else {
    m["label"] = absl::StrCat(FieldDescriptor::Label::LABEL_OPTIONAL);
  }
  // We always set message_type and enum_type to None at this point, and then
  // these fields in correctly after all referenced descriptors have been
  // defined and/or imported (see FixForeignFieldsInDescriptors()).
  const char field_descriptor_decl[] =
      "_descriptor.FieldDescriptor(\n"
      "  name='$name$', full_name='$full_name$', index=$index$,\n"
      "  number=$number$, type=$type$, cpp_type=$cpp_type$, label=$label$,\n"
      "  has_default_value=$has_default_value$, "
      "default_value=$default_value$,\n"
      "  message_type=None, enum_type=None, containing_type=None,\n"
      "  is_extension=$is_extension$, extension_scope=None,\n"
      "  serialized_options=$serialized_options$$json_name$, file=DESCRIPTOR,"
      "  create_key=_descriptor._internal_create_key)";
  printer_->Print(m, field_descriptor_decl);
}